

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

void __thiscall
Js::FunctionBody::SetPropertyIdsOfFormals(FunctionBody *this,PropertyIdArray *formalArgs)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  PropertyIdOnRegSlotsContainer *pPVar4;
  Recycler *recycler;
  PropertyIdArray *formalArgs_local;
  FunctionBody *this_local;
  
  if (formalArgs == (PropertyIdArray *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1355,"(formalArgs)","formalArgs");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  pPVar4 = GetPropertyIdOnRegSlotsContainer(this);
  if (pPVar4 == (PropertyIdOnRegSlotsContainer *)0x0) {
    recycler = ScriptContext::GetRecycler
                         ((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext);
    pPVar4 = PropertyIdOnRegSlotsContainer::New(recycler);
    SetPropertyIdOnRegSlotsContainer(this,pPVar4);
  }
  pPVar4 = GetPropertyIdOnRegSlotsContainer(this);
  PropertyIdOnRegSlotsContainer::SetFormalArgs(pPVar4,formalArgs);
  return;
}

Assistant:

void FunctionBody::SetPropertyIdsOfFormals(PropertyIdArray * formalArgs)
    {
        Assert(formalArgs);
        if (this->GetPropertyIdOnRegSlotsContainer() == nullptr)
        {
            this->SetPropertyIdOnRegSlotsContainer(PropertyIdOnRegSlotsContainer::New(m_scriptContext->GetRecycler()));
        }
        this->GetPropertyIdOnRegSlotsContainer()->SetFormalArgs(formalArgs);
    }